

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall
Fl_Text_Display::xy_to_rowcol(Fl_Text_Display *this,int X,int Y,int *row,int *column,int posType)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (Y - (this->text_area).y) / this->mMaxsize;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  *row = iVar1;
  if (this->mNVisibleLines <= iVar1) {
    *row = this->mNVisibleLines + -1;
  }
  iVar2 = (((uint)(posType == 0) * 3 + X) - (this->text_area).x) + this->mHorizOffset;
  iVar1 = iVar2 / 6;
  if (iVar2 < -5) {
    iVar1 = 0;
  }
  *column = iVar1;
  return;
}

Assistant:

void Fl_Text_Display::xy_to_rowcol( int X, int Y, int *row,
                                   int *column, int posType ) const {
  int fontHeight = mMaxsize;
  int fontWidth = TMPFONTWIDTH;   //mFontStruct->max_bounds.width;

  /* Find the visible line number corresponding to the Y coordinate */
  *row = ( Y - text_area.y ) / fontHeight;
  if ( *row < 0 ) *row = 0;
  if ( *row >= mNVisibleLines ) *row = mNVisibleLines - 1;

  *column = ( ( X - text_area.x ) + mHorizOffset +
             ( posType == CURSOR_POS ? fontWidth / 2 : 0 ) ) / fontWidth;
  if ( *column < 0 ) * column = 0;
}